

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O2

void Sim_SymmsBalanceCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  
  for (; ((ulong)pNode & 1) == 0;
      pNode = (Abc_Obj_t *)
              ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
              (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]])) {
    uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar1 == 5) || (uVar1 == 2)) break;
    Sim_SymmsBalanceCollect_rec
              ((Abc_Obj_t *)
               ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
               (ulong)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]),vNodes);
  }
  Vec_PtrPushUnique(vNodes,pNode);
  return;
}

Assistant:

void Sim_SymmsBalanceCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    // if the new node is complemented, another gate begins
    if ( Abc_ObjIsComplement(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;
    }
    // if pNew is the PI node, return
    if ( Abc_ObjIsCi(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;    
    }
    // go through the branches
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild0(pNode), vNodes );
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild1(pNode), vNodes );
}